

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundostack.cpp
# Opt level: O2

void __thiscall QUndoStack::setUndoLimit(QUndoStack *this,int limit)

{
  QUndoStackPrivate *this_00;
  long in_FS_OFFSET;
  char local_28 [24];
  char *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QUndoStackPrivate **)&this->field_0x8;
  if ((this_00->command_list).d.size == 0) {
    if (this_00->undo_limit != limit) {
      this_00->undo_limit = limit;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        QUndoStackPrivate::checkUndoLimit(this_00);
        return;
      }
      goto LAB_00562bf3;
    }
  }
  else {
    local_28[0] = '\x02';
    local_28[1] = '\0';
    local_28[2] = '\0';
    local_28[3] = '\0';
    local_28[0x14] = '\0';
    local_28[0x15] = '\0';
    local_28[0x16] = '\0';
    local_28[0x17] = '\0';
    local_28[4] = '\0';
    local_28[5] = '\0';
    local_28[6] = '\0';
    local_28[7] = '\0';
    local_28[8] = '\0';
    local_28[9] = '\0';
    local_28[10] = '\0';
    local_28[0xb] = '\0';
    local_28[0xc] = '\0';
    local_28[0xd] = '\0';
    local_28[0xe] = '\0';
    local_28[0xf] = '\0';
    local_28[0x10] = '\0';
    local_28[0x11] = '\0';
    local_28[0x12] = '\0';
    local_28[0x13] = '\0';
    local_10 = "default";
    QMessageLogger::warning
              (local_28,
               "QUndoStack::setUndoLimit(): an undo limit can only be set when the stack is empty");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_00562bf3:
  __stack_chk_fail();
}

Assistant:

void QUndoStack::setUndoLimit(int limit)
{
    Q_D(QUndoStack);

    if (Q_UNLIKELY(!d->command_list.isEmpty())) {
        qWarning("QUndoStack::setUndoLimit(): an undo limit can only be set when the stack is empty");
        return;
    }

    if (limit == d->undo_limit)
        return;
    d->undo_limit = limit;
    d->checkUndoLimit();
}